

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayFirstGroup::init
          (SingleVertexArrayFirstGroup *this,EVP_PKEY_CTX *ctx)

{
  pointer *ppAVar1;
  int t;
  int t_00;
  GLValue max_;
  InputType IVar2;
  int iVar3;
  int iVar4;
  undefined8 in_RAX;
  long *plVar5;
  undefined8 *puVar6;
  MultiVertexArrayTest *this_00;
  undefined8 uVar7;
  long *plVar8;
  ulong *puVar9;
  int **ppiVar10;
  long lVar11;
  InputType IVar12;
  ulong uVar13;
  int *piVar14;
  undefined8 unaff_R15;
  bool bVar15;
  GLValue GVar16;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_208 [16];
  pointer local_1f8;
  pointer pAStack_1f0;
  pointer local_1e8;
  long *local_1e0;
  undefined8 local_1d8;
  long local_1d0;
  undefined8 uStack_1c8;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  long local_1a0;
  SingleVertexArrayFirstGroup *local_198;
  ulong *local_190;
  long local_188;
  ulong local_180;
  long lStack_178;
  ulong *local_170;
  long local_168;
  ulong local_160;
  long lStack_158;
  uint local_14c;
  uint local_148;
  uint local_144;
  long local_140;
  string local_138;
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 local_b8 [16];
  int *local_a8;
  long lStack_a0;
  long local_78;
  string local_70;
  InputType local_50;
  undefined4 uStack_4c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_48;
  InputType local_40;
  undefined4 uStack_3c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_38;
  
  uVar7 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  local_1a0 = 0;
  local_198 = this;
  do {
    local_14c = (uint)uVar7;
    uVar7 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
    local_140 = 0;
    do {
      local_148 = (uint)uVar7;
      local_78 = 0;
      do {
        unaff_R15 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
        lVar11 = 0;
        do {
          IVar12 = this->m_type;
          IVar2 = IVar12 & ~INPUTTYPE_FIXED;
          if (local_78 == 0) {
            iVar3 = 8;
            if (IVar2 != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar3 = deqp::gls::Array::inputTypeSize(IVar12);
              iVar3 = iVar3 * 2;
              IVar12 = this->m_type;
              goto LAB_013900a1;
            }
LAB_01390086:
            iVar4 = deqp::gls::Array::inputTypeSize(IVar12);
            iVar4 = iVar4 << 2;
          }
          else {
            iVar3 = (&DAT_01c29f78)[local_78];
            if (IVar2 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) goto LAB_01390086;
LAB_013900a1:
            iVar4 = deqp::gls::Array::inputTypeSize(IVar12);
          }
          if (iVar3 % iVar4 == 0) {
            bVar15 = *(int *)(&DAT_01be5a88 + local_1a0 * 4) % iVar4 == 0;
          }
          else {
            bVar15 = false;
          }
          iVar4 = (&DAT_01bc2918)[lVar11];
          typeToString<int>(&local_70,iVar4);
          plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1bc5880);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            local_c8 = *plVar8;
            lStack_c0 = plVar5[3];
            local_d8 = &local_c8;
          }
          else {
            local_c8 = *plVar8;
            local_d8 = (long *)*plVar5;
          }
          local_d0 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_190 = &local_180;
          puVar9 = (ulong *)(plVar5 + 2);
          local_144 = (uint)unaff_R15;
          if ((ulong *)*plVar5 == puVar9) {
            local_180 = *puVar9;
            lStack_178 = plVar5[3];
          }
          else {
            local_180 = *puVar9;
            local_190 = (ulong *)*plVar5;
          }
          local_188 = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          t = *(int *)(&DAT_01be5a88 + local_1a0 * 4);
          typeToString<int>(&local_f8,t);
          uVar13 = 0xf;
          if (local_190 != &local_180) {
            uVar13 = local_180;
          }
          if (uVar13 < local_f8._M_string_length + local_188) {
            uVar7 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              uVar7 = local_f8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar7 < local_f8._M_string_length + local_188) goto LAB_01390252;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,(ulong)local_190);
          }
          else {
LAB_01390252:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_190,(ulong)local_f8._M_dataplus._M_p);
          }
          local_1e0 = &local_1d0;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_1d0 = *plVar5;
            uStack_1c8 = puVar6[3];
          }
          else {
            local_1d0 = *plVar5;
            local_1e0 = (long *)*puVar6;
          }
          local_1d8 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          plVar5 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          local_170 = &local_160;
          puVar9 = (ulong *)(plVar5 + 2);
          if ((ulong *)*plVar5 == puVar9) {
            local_160 = *puVar9;
            lStack_158 = plVar5[3];
          }
          else {
            local_160 = *puVar9;
            local_170 = (ulong *)*plVar5;
          }
          local_168 = plVar5[1];
          *plVar5 = (long)puVar9;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          typeToString<int>(&local_118,iVar3);
          uVar13 = 0xf;
          if (local_170 != &local_160) {
            uVar13 = local_160;
          }
          if (uVar13 < local_118._M_string_length + local_168) {
            uVar7 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              uVar7 = local_118.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar7 < local_118._M_string_length + local_168) goto LAB_01390392;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_170)
            ;
          }
          else {
LAB_01390392:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_170,(ulong)local_118._M_dataplus._M_p);
          }
          local_208._0_8_ = &local_1f8;
          ppAVar1 = (pointer *)(puVar6 + 2);
          if ((pointer *)*puVar6 == ppAVar1) {
            local_1f8 = *ppAVar1;
            pAStack_1f0 = (pointer)puVar6[3];
          }
          else {
            local_1f8 = *ppAVar1;
            local_208._0_8_ = (pointer *)*puVar6;
          }
          local_208._8_8_ = puVar6[1];
          *puVar6 = ppAVar1;
          puVar6[1] = 0;
          *(undefined1 *)ppAVar1 = 0;
          plVar5 = (long *)std::__cxx11::string::append(local_208);
          local_b8._0_8_ = &local_a8;
          ppiVar10 = (int **)(plVar5 + 2);
          if ((int **)*plVar5 == ppiVar10) {
            local_a8 = *ppiVar10;
            lStack_a0 = plVar5[3];
          }
          else {
            local_a8 = *ppiVar10;
            local_b8._0_8_ = (int **)*plVar5;
          }
          local_b8._8_8_ = plVar5[1];
          *plVar5 = (long)ppiVar10;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          t_00 = *(int *)(&DAT_01bc2910 + local_140 * 4);
          typeToString<int>(&local_138,t_00);
          piVar14 = (int *)0xf;
          if ((int **)local_b8._0_8_ != &local_a8) {
            piVar14 = local_a8;
          }
          if (piVar14 < (int *)(local_138._M_string_length + local_b8._8_8_)) {
            uVar7 = (int *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              uVar7 = local_138.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar7 < (int *)(local_138._M_string_length + local_b8._8_8_))
            goto LAB_013904e5;
            puVar6 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_138,0,(char *)0x0,local_b8._0_8_);
          }
          else {
LAB_013904e5:
            puVar6 = (undefined8 *)
                     std::__cxx11::string::_M_append(local_b8,(ulong)local_138._M_dataplus._M_p);
          }
          local_1c0 = &local_1b0;
          plVar5 = puVar6 + 2;
          if ((long *)*puVar6 == plVar5) {
            local_1b0 = *plVar5;
            uStack_1a8 = puVar6[3];
          }
          else {
            local_1b0 = *plVar5;
            local_1c0 = (long *)*puVar6;
          }
          local_1b8 = puVar6[1];
          *puVar6 = plVar5;
          puVar6[1] = 0;
          *(undefined1 *)plVar5 = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((int **)local_b8._0_8_ != &local_a8) {
            operator_delete((void *)local_b8._0_8_,(long)local_a8 + 1);
          }
          if ((pointer *)local_208._0_8_ != &local_1f8) {
            operator_delete((void *)local_208._0_8_,(ulong)((long)&local_1f8->inputType + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if (local_170 != &local_160) {
            operator_delete(local_170,local_160 + 1);
          }
          if (local_1e0 != &local_1d0) {
            operator_delete(local_1e0,local_1d0 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if (local_190 != &local_180) {
            operator_delete(local_190,local_180 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          IVar12 = local_198->m_type;
          GVar16 = deqp::gls::GLValue::getMinValue(IVar12);
          aStack_38 = GVar16.field_1;
          local_40 = GVar16.type;
          GVar16 = deqp::gls::GLValue::getMaxValue(local_198->m_type);
          aStack_48 = GVar16.field_1;
          local_50 = GVar16.type;
          max_._4_4_ = uStack_4c;
          max_.type = local_50;
          GVar16._4_4_ = uStack_3c;
          GVar16.type = local_40;
          GVar16.field_1 = aStack_38;
          max_.field_1 = aStack_48;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    ((ArraySpec *)local_b8,IVar12,OUTPUTTYPE_VEC2,STORAGE_BUFFER,USAGE_DYNAMIC_DRAW,
                     (uint)(IVar2 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) * 2 + 2,t,iVar3,false,GVar16
                     ,max_);
          local_1f8 = (pointer)0x0;
          pAStack_1f0 = (pointer)0x0;
          local_1e8 = (pointer)0x0;
          local_208._4_4_ = t_00;
          local_208._0_4_ = PRIMITIVE_TRIANGLES;
          local_208._8_4_ = iVar4;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_1f8,(iterator)0x0,(ArraySpec *)local_b8);
          this = local_198;
          if (!bVar15) {
            this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
            deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                      (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                               m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                       (Spec *)local_208,(char *)local_1c0,(char *)local_1c0);
            tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          }
          if (local_1f8 != (pointer)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
          if (local_1c0 != &local_1b0) {
            operator_delete(local_1c0,local_1b0 + 1);
          }
          lVar11 = 1;
          unaff_R15 = 0;
        } while ((local_144 & 1) != 0);
        local_78 = local_78 + 1;
      } while (local_78 != 3);
      local_140 = 1;
      uVar7 = 0;
    } while ((local_148 & 1) != 0);
    local_1a0 = 1;
    uVar7 = 0;
    if ((local_14c & 1) == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

void SingleVertexArrayFirstGroup::init (void)
{
	int					counts[]		= {5, 256};
	int					firsts[]		= {6, 24};
	int					offsets[]		= {1, 17};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int offsetNdx = 0; offsetNdx < DE_LENGTH_OF_ARRAY(offsets); offsetNdx++)
	{
		for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
		{
			for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
			{
				for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); firstNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	componentCount	= (packed) ? (4) : (2);
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (8) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	aligned			= ((stride % alignment) == 0) && ((offsets[offsetNdx] % alignment) == 0);
					std::string name			= "first" + typeToString(firsts[firstNdx]) + "_offset" + typeToString(offsets[offsetNdx]) + "_stride" + typeToString(stride) + "_quads" + typeToString(counts[countNdx]);

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC2,
																	Array::STORAGE_BUFFER,
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	offsets[offsetNdx],
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= firsts[firstNdx];
					spec.arrays.push_back(arraySpec);

					if (!aligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}